

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckTarget(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Bool BVar1;
  ctmbstr local_48;
  ctmbstr values [5];
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  values[4] = (ctmbstr)attval;
  memcpy(&local_48,&PTR_anon_var_dwarf_21462_001ee7c0,0x28);
  if ((values[4] == (ctmbstr)0x0) || (*(long *)(values[4] + 0x30) == 0)) {
    prvTidyReportAttrError(doc,node,(AttVal *)values[4],0x256);
  }
  else {
    BVar1 = prvTidyIsLetter((int)**(char **)(values[4] + 0x30));
    if ((BVar1 == no) && (BVar1 = AttrValueIsAmong((AttVal *)values[4],&local_48), BVar1 == no)) {
      prvTidyReportAttrError(doc,node,(AttVal *)values[4],0x22b);
    }
  }
  return;
}

Assistant:

void CheckTarget( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    ctmbstr const values[] = {"_blank", "_self", "_parent", "_top", NULL};

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* target names must begin with A-Za-z ... */
    if (TY_(IsLetter)(attval->value[0]))
        return;

    /* or be one of the allowed list */
    if (!AttrValueIsAmong(attval, values))
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
}